

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeDataViewPrototype
               (DynamicObject *dataViewPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *dataViewPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,dataViewPrototype,mode,2,0);
  this = RecyclableObject::GetScriptContext(&dataViewPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&dataViewPrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)
                       &(this_00->super_JavascriptLibraryBase).dataViewConstructor);
  AddMember(this_00,dataViewPrototype,0x67,*ppRVar2);
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1bb,(FunctionInfo *)DataView::EntryInfo::SetInt8,2,'\x06');
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1bc,(FunctionInfo *)DataView::EntryInfo::SetUint8,2,'\x06')
  ;
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1bd,(FunctionInfo *)DataView::EntryInfo::SetInt16,2,'\x06')
  ;
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1be,(FunctionInfo *)DataView::EntryInfo::SetUint16,2,'\x06'
            );
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1bf,(FunctionInfo *)DataView::EntryInfo::SetInt32,2,'\x06')
  ;
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c0,(FunctionInfo *)DataView::EntryInfo::SetUint32,2,'\x06'
            );
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c1,(FunctionInfo *)DataView::EntryInfo::SetFloat32,2,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c2,(FunctionInfo *)DataView::EntryInfo::SetFloat64,2,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c3,(FunctionInfo *)DataView::EntryInfo::GetInt8,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c4,(FunctionInfo *)DataView::EntryInfo::GetUint8,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c5,(FunctionInfo *)DataView::EntryInfo::GetInt16,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c6,(FunctionInfo *)DataView::EntryInfo::GetUint16,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c7,(FunctionInfo *)DataView::EntryInfo::GetInt32,1,'\x06')
  ;
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c8,(FunctionInfo *)DataView::EntryInfo::GetUint32,1,'\x06'
            );
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1c9,(FunctionInfo *)DataView::EntryInfo::GetFloat32,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,dataViewPrototype,0x1ca,(FunctionInfo *)DataView::EntryInfo::GetFloat64,1,
             '\x06');
  AddAccessorsToLibraryObject
            (this_00,dataViewPrototype,0x1aa,(FunctionInfo *)DataView::EntryInfo::GetterBuffer,
             (FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this_00,dataViewPrototype,0x1a9,(FunctionInfo *)DataView::EntryInfo::GetterByteLength,
             (FunctionInfo *)0x0);
  AddAccessorsToLibraryObject
            (this_00,dataViewPrototype,0x1a8,(FunctionInfo *)DataView::EntryInfo::GetterByteOffset,
             (FunctionInfo *)0x0);
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value = CreateStringFromCppLiteral<9ul>(this_00,(char16 (*) [9])0x198f80a);
    AddMember(this_00,dataViewPrototype,0x1b,value,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(dataViewPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeDataViewPrototype(DynamicObject* dataViewPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(dataViewPrototype, mode, 2);

        ScriptContext* scriptContext = dataViewPrototype->GetScriptContext();
        JavascriptLibrary* library = dataViewPrototype->GetLibrary();
        library->AddMember(dataViewPrototype, PropertyIds::constructor, library->dataViewConstructor);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt8, &DataView::EntryInfo::SetInt8, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint8, &DataView::EntryInfo::SetUint8, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt16, &DataView::EntryInfo::SetInt16, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint16, &DataView::EntryInfo::SetUint16, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setInt32, &DataView::EntryInfo::SetInt32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setUint32, &DataView::EntryInfo::SetUint32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setFloat32, &DataView::EntryInfo::SetFloat32, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::setFloat64, &DataView::EntryInfo::SetFloat64, 2);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt8, &DataView::EntryInfo::GetInt8, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint8, &DataView::EntryInfo::GetUint8, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt16, &DataView::EntryInfo::GetInt16, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint16, &DataView::EntryInfo::GetUint16, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getInt32, &DataView::EntryInfo::GetInt32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getUint32, &DataView::EntryInfo::GetUint32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getFloat32, &DataView::EntryInfo::GetFloat32, 1);
        library->AddFunctionToLibraryObject(dataViewPrototype, PropertyIds::getFloat64, &DataView::EntryInfo::GetFloat64, 1);

        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::buffer, &DataView::EntryInfo::GetterBuffer, nullptr);
        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::byteLength, &DataView::EntryInfo::GetterByteLength, nullptr);
        library->AddAccessorsToLibraryObject(dataViewPrototype, PropertyIds::byteOffset, &DataView::EntryInfo::GetterByteOffset, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(dataViewPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("DataView")), PropertyConfigurable);
        }

        dataViewPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }